

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall TaprootScriptTree_TreeTest2_Test::TestBody(TaprootScriptTree_TreeTest2_Test *this)

{
  initializer_list<TestScriptTree2Data> __l;
  pointer pBVar1;
  bool bVar2;
  ScriptBuilder *pSVar3;
  char *pcVar4;
  Script *tapscript;
  size_t *lhs;
  reference this_00;
  TestScriptTree2Data *local_1af0;
  AssertionResult gtest_ar_18;
  CfdException *except;
  Message local_17d8;
  string local_17d0;
  undefined1 local_17b0 [8];
  AssertionResult gtest_ar_17;
  Message local_1798;
  Script local_1790;
  string local_1758;
  undefined1 local_1738 [8];
  AssertionResult gtest_ar_16;
  allocator local_1709;
  string local_1708;
  TaprootScriptTree local_16e8;
  AssertHelper local_1650;
  Message local_1648;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar_15;
  ByteData256 *node;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range2;
  string nodes;
  Message local_15b0;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_15a8;
  size_type local_1590;
  undefined1 local_1588 [8];
  AssertionResult gtest_ar_14;
  Message local_1570;
  Script local_1568;
  string local_1530;
  string local_1510;
  undefined1 local_14f0 [8];
  AssertionResult gtest_ar_13;
  Message local_14d8;
  string local_14d0;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar_12;
  Message local_1498;
  ByteData256 local_1490;
  string local_1478;
  undefined1 local_1458 [8];
  AssertionResult gtest_ar_11;
  allocator local_1429;
  string local_1428;
  TaprootScriptTree local_1408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1370;
  ScopedTrace local_1349;
  reference pTStack_1348;
  ScopedTrace gtest_trace_414;
  TestScriptTree2Data *test_data;
  iterator __end1;
  iterator __begin1;
  vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> *__range1;
  Message local_1320;
  string local_1318;
  undefined1 local_12f8 [8];
  AssertionResult gtest_ar_10;
  Message local_12e0;
  ByteData256 local_12d8;
  string local_12c0;
  undefined1 local_12a0 [8];
  AssertionResult gtest_ar_9;
  TaprootScriptTree tree;
  TaprootScriptTree local_1160;
  TaprootScriptTree local_10c8;
  TaprootScriptTree local_1030;
  undefined1 local_f98 [8];
  TaprootScriptTree tree_b;
  TaprootScriptTree local_e68;
  undefined1 local_dd0 [8];
  TaprootScriptTree tree_efg;
  char *exp_str;
  char *exp_hash;
  undefined1 local_d20;
  undefined1 local_d1f;
  allocator local_d1e;
  allocator local_d1d;
  undefined1 local_d1c;
  undefined1 local_d1b;
  allocator local_d1a;
  allocator local_d19;
  undefined1 local_d18;
  undefined1 local_d17;
  allocator local_d16;
  allocator local_d15;
  undefined1 local_d14;
  undefined1 local_d13;
  allocator local_d12;
  allocator local_d11;
  undefined1 local_d10;
  undefined1 local_d0f;
  allocator local_d0e;
  allocator local_d0d;
  undefined1 local_d0c;
  undefined1 local_d0b;
  allocator local_d0a;
  allocator local_d09;
  undefined1 local_d08;
  undefined1 local_d07;
  allocator local_d06;
  allocator local_d05;
  undefined1 local_d04;
  undefined1 local_d03;
  allocator local_d02;
  allocator local_d01;
  TestScriptTree2Data *local_d00;
  TestScriptTree2Data local_cf8;
  string local_c78 [32];
  Script SStack_c58;
  undefined8 local_c20;
  string asStack_c18 [32];
  string local_bf8 [32];
  Script SStack_bd8;
  undefined8 local_ba0;
  string asStack_b98 [32];
  string local_b78 [32];
  Script SStack_b58;
  undefined8 local_b20;
  string asStack_b18 [32];
  string local_af8 [32];
  Script SStack_ad8;
  undefined8 local_aa0;
  string asStack_a98 [32];
  string local_a78 [32];
  Script SStack_a58;
  undefined8 local_a20;
  string asStack_a18 [32];
  string local_9f8 [32];
  Script SStack_9d8;
  undefined8 local_9a0;
  string asStack_998 [32];
  string local_978 [32];
  Script SStack_958;
  undefined8 local_920;
  string asStack_918 [32];
  iterator local_8f8;
  size_type local_8f0;
  undefined1 local_8e8 [8];
  vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> exp_list;
  Message local_8c8;
  string local_8c0;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_8;
  Message local_888;
  string local_880;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_7;
  Message local_848;
  string local_840;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_6;
  Message local_808;
  string local_800;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_5;
  Message local_7c8;
  string local_7c0;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_4;
  Message local_788;
  string local_780;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_3;
  Message local_748;
  string local_740;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_2;
  Message local_708;
  string local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_1;
  Message local_6c8;
  string local_6c0;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar;
  ScriptBuilder local_678;
  undefined1 local_658 [8];
  Script script_j;
  ByteData local_608;
  ScriptBuilder local_5f0;
  undefined1 local_5d0 [8];
  Script script_h;
  ScriptBuilder local_580;
  undefined1 local_560 [8];
  Script script_g;
  ScriptBuilder local_510;
  undefined1 local_4f0 [8];
  Script script_f;
  ScriptBuilder local_4a0;
  undefined1 local_480 [8];
  Script script_e;
  ByteData local_430;
  ScriptBuilder local_418;
  undefined1 local_3f8 [8];
  Script script_d;
  ScriptBuilder local_3a8;
  undefined1 local_388 [8];
  Script script_c;
  undefined1 local_330 [8];
  Script script_b;
  ScriptBuilder local_2e0;
  undefined1 local_2c0 [8];
  Script script_a;
  SchnorrPubkey schnorr_pubkey32;
  SchnorrPubkey schnorr_pubkey31;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey22;
  SchnorrPubkey schnorr_pubkey21;
  SchnorrPubkey schnorr_pubkey2;
  SchnorrPubkey schnorr_pubkey12;
  SchnorrPubkey schnorr_pubkey11;
  SchnorrPubkey schnorr_pubkey1;
  Pubkey pubkey3;
  Pubkey pubkey2;
  Pubkey pubkey1;
  string local_160;
  undefined1 local_140 [8];
  ByteData256 tweak4;
  string local_120;
  undefined1 local_100 [8];
  ByteData256 tweak3;
  string local_e0;
  undefined1 local_c0 [8];
  ByteData256 tweak2;
  string local_a0;
  undefined1 local_80 [8];
  ByteData256 tweak1;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootScriptTree_TreeTest2_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)
             ((long)&tweak3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak3.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475"
             ,(allocator *)
              ((long)&tweak4.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak4.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e"
             ,(allocator *)
              ((long)&pubkey1.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::GeneratePubkey
            ((Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_30,true);
  cfd::core::operator+
            ((Pubkey *)
             &pubkey3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_100);
  cfd::core::operator+
            ((Pubkey *)
             &schnorr_pubkey1.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_140);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey2.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_c0);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pubkey3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey22.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_c0);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &schnorr_pubkey1.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(bool *)0x0);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &schnorr_pubkey32.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80);
  cfd::core::operator+
            ((SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_c0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_2e0);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_b.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_2e0,
                      (ByteData *)
                      &script_b.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_2c0,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_b.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_2e0);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &script_c.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)
                      &script_c.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_330,pSVar3);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &script_c.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_3a8);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_d.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_3a8,
                      (ByteData *)
                      &script_d.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_388,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_d.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_3a8);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_418);
  cfd::core::SchnorrPubkey::GetData
            (&local_430,
             (SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<(&local_418,&local_430);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_e.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey2.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ByteData *)
                             &script_e.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_3f8,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_e.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_430);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_418);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_4a0);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_f.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_4a0,
                      (ByteData *)
                      &script_f.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_480,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_f.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_4a0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_510);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_g.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey22.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_510,
                      (ByteData *)
                      &script_g.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_4f0,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_g.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_510);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_580);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_h.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_580,
                      (ByteData *)
                      &script_h.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_560,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_h.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_580);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_5f0);
  cfd::core::SchnorrPubkey::GetData
            (&local_608,
             (SchnorrPubkey *)
             &schnorr_pubkey32.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<(&local_5f0,&local_608);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &script_j.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ByteData *)
                             &script_j.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_5d0,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &script_j.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_608);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_5f0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_678);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)&gtest_ar.message_,
             (SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<(&local_678,(ByteData *)&gtest_ar.message_);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_658,pSVar3);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_678);
  cfd::core::Script::GetHex_abi_cxx11_(&local_6c0,(Script *)local_2c0);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_6a0,
             "\"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac\"",
             "script_a.GetHex()",
             (char (*) [69])"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
             &local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar2) {
    testing::Message::Message(&local_6c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x15a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_700,(Script *)local_330);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_6e0,"\"51\"","script_b.GetHex()",(char (*) [3])0x889c42,
             &local_700);
  std::__cxx11::string::~string((string *)&local_700);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar2) {
    testing::Message::Message(&local_708);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x15b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_740,(Script *)local_388);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_720,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac\"",
             "script_c.GetHex()",
             (char (*) [69])"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac",
             &local_740);
  std::__cxx11::string::~string((string *)&local_740);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar2) {
    testing::Message::Message(&local_748);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x15c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  cfd::core::Script::GetHex_abi_cxx11_(&local_780,(Script *)local_3f8);
  testing::internal::EqHelper<false>::Compare<char[137],std::__cxx11::string>
            ((EqHelper<false> *)local_760,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac\""
             ,"script_d.GetHex()",
             (char (*) [137])
             "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
             ,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar2) {
    testing::Message::Message(&local_788);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x15d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  cfd::core::Script::GetHex_abi_cxx11_(&local_7c0,(Script *)local_480);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_7a0,
             "\"20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac\"",
             "script_e.GetHex()",
             (char (*) [69])"20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac",
             &local_7c0);
  std::__cxx11::string::~string((string *)&local_7c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar2) {
    testing::Message::Message(&local_7c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x15e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_800,(Script *)local_4f0);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_7e0,
             "\"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac\"",
             "script_f.GetHex()",
             (char (*) [69])"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac",
             &local_800);
  std::__cxx11::string::~string((string *)&local_800);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar2) {
    testing::Message::Message(&local_808);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x15f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_840,(Script *)local_560);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_820,
             "\"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac\"",
             "script_g.GetHex()",
             (char (*) [69])"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac",
             &local_840);
  std::__cxx11::string::~string((string *)&local_840);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar2) {
    testing::Message::Message(&local_848);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x160,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  cfd::core::Script::GetHex_abi_cxx11_(&local_880,(Script *)local_5d0);
  testing::internal::EqHelper<false>::Compare<char[137],std::__cxx11::string>
            ((EqHelper<false> *)local_860,
             "\"2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\""
             ,"script_h.GetHex()",
             (char (*) [137])
             "2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac"
             ,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar2) {
    testing::Message::Message(&local_888);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x161,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  cfd::core::Script::GetHex_abi_cxx11_(&local_8c0,(Script *)local_658);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_8a0,
             "\"20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\"",
             "script_j.GetHex()",(char (*) [69])0x738e18,&local_8c0);
  std::__cxx11::string::~string((string *)&local_8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar2) {
    testing::Message::Message(&local_8c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &exp_list.
                super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x162,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &exp_list.
                super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &exp_list.
                super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  exp_hash._7_1_ = 1;
  local_d00 = &local_cf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cf8,"a",&local_d01);
  local_d04 = 1;
  cfd::core::Script::Script(&local_cf8.script,(Script *)local_2c0);
  local_d03 = 1;
  local_cf8.depth = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cf8.nodes,
             "4b3bb79ea92e0b4f2bfa7e8c88d81133e347da393d72a37fe9cdcf1f5f56b5e0e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d02);
  local_d03 = 0;
  local_d04 = 0;
  local_d00 = (TestScriptTree2Data *)local_c78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c78,"b",&local_d05);
  local_d08 = 1;
  cfd::core::Script::Script(&SStack_c58,(Script *)local_330);
  local_d07 = 1;
  local_c20 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_c18,
             "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d06);
  local_d07 = 0;
  local_d08 = 0;
  local_d00 = (TestScriptTree2Data *)local_bf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"c",&local_d09);
  local_d0c = 1;
  cfd::core::Script::Script(&SStack_bd8,(Script *)local_388);
  local_d0b = 1;
  local_ba0 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_b98,
             "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d6754691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d0a);
  local_d0b = 0;
  local_d0c = 0;
  local_d00 = (TestScriptTree2Data *)local_b78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b78,"d",&local_d0d);
  local_d10 = 1;
  cfd::core::Script::Script(&SStack_b58,(Script *)local_3f8);
  local_d0f = 1;
  local_b20 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_b18,
             "7da36533760cede4c164d5c00eb1500a27dd86ca76914a9874112c43e0c1b9450db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d0e);
  local_d0f = 0;
  local_d10 = 0;
  local_d00 = (TestScriptTree2Data *)local_af8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af8,"e",&local_d11);
  local_d14 = 1;
  cfd::core::Script::Script(&SStack_ad8,(Script *)local_480);
  local_d13 = 1;
  local_aa0 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_a98,
             "aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d12);
  local_d13 = 0;
  local_d14 = 0;
  local_d00 = (TestScriptTree2Data *)local_a78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a78,"f",&local_d15);
  local_d18 = 1;
  cfd::core::Script::Script(&SStack_a58,(Script *)local_4f0);
  local_d17 = 1;
  local_a20 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_a18,
             "1aac269b1edaa45c69fb8d1a703a1bb69e90129cef7b7cfe9e676b28e6d1175d7f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d16);
  local_d17 = 0;
  local_d18 = 0;
  local_d00 = (TestScriptTree2Data *)local_9f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f8,"g",&local_d19);
  local_d1c = 1;
  cfd::core::Script::Script(&SStack_9d8,(Script *)local_560);
  local_d1b = 1;
  local_9a0 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_998,
             "e82da59bb829eb21f7cb8eb9eb128626da9a9a31f3dfdeb29766faf14468e9967f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_d1a);
  local_d1b = 0;
  local_d1c = 0;
  local_d00 = (TestScriptTree2Data *)local_978;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"h",&local_d1d);
  local_d20 = 1;
  cfd::core::Script::Script(&SStack_958,(Script *)local_5d0);
  local_d1f = 1;
  local_920 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_918,"8f43855f8d9916a2cece54e67b4ce08950a60cc3cce8907d34e03788ade5a977",
             &local_d1e);
  local_d1f = 0;
  local_d20 = 0;
  exp_hash._7_1_ = 0;
  local_8f8 = &local_cf8;
  local_8f0 = 8;
  std::allocator<TestScriptTree2Data>::allocator
            ((allocator<TestScriptTree2Data> *)((long)&exp_hash + 6));
  __l._M_len = local_8f0;
  __l._M_array = local_8f8;
  std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>::vector
            ((vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> *)local_8e8,__l,
             (allocator<TestScriptTree2Data> *)((long)&exp_hash + 6));
  std::allocator<TestScriptTree2Data>::~allocator
            ((allocator<TestScriptTree2Data> *)((long)&exp_hash + 6));
  local_1af0 = (TestScriptTree2Data *)&local_8f8;
  do {
    local_1af0 = local_1af0 + -1;
    TestBody::TestScriptTree2Data::~TestScriptTree2Data(local_1af0);
  } while (local_1af0 != &local_cf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  std::allocator<char>::~allocator((allocator<char> *)&local_d16);
  std::allocator<char>::~allocator((allocator<char> *)&local_d15);
  std::allocator<char>::~allocator((allocator<char> *)&local_d12);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  std::allocator<char>::~allocator((allocator<char> *)&local_d0e);
  std::allocator<char>::~allocator((allocator<char> *)&local_d0d);
  std::allocator<char>::~allocator((allocator<char> *)&local_d0a);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::allocator<char>::~allocator((allocator<char> *)&local_d06);
  std::allocator<char>::~allocator((allocator<char> *)&local_d05);
  std::allocator<char>::~allocator((allocator<char> *)&local_d02);
  std::allocator<char>::~allocator((allocator<char> *)&local_d01);
  exp_str = "ca0e12942fdb00ad71e84e02c44c0b9136e60ff2c25bcb3cade4d7dc53d246df";
  tree_efg.nodes_.
  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_1a7051;
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_dd0,(Script *)local_4f0);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_e68,(Script *)local_560);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_dd0,&local_e68);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_e68);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_b.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_480);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_dd0,
             (TaprootScriptTree *)
             &tree_b.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_b.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_f98,(Script *)local_330);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_1030,(Script *)local_388);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_f98,&local_1030);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1030);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_10c8,(Script *)local_2c0);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_f98,&local_10c8);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_10c8);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&local_1160,(Script *)local_3f8);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_f98,&local_1160);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1160);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_f98,(TaprootScriptTree *)local_dd0);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_5d0);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)local_f98,
             (TaprootScriptTree *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_9.message_,(TaprootScriptTree *)local_f98);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_12d8,(TapBranch *)&gtest_ar_9.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_12c0,&local_12d8);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_12a0,"exp_hash","tree.GetCurrentBranchHash().GetHex()",
             &exp_str,&local_12c0);
  std::__cxx11::string::~string((string *)&local_12c0);
  cfd::core::ByteData256::~ByteData256(&local_12d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a0);
  if (!bVar2) {
    testing::Message::Message(&local_12e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_12a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x19a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_12e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_12e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a0);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_1318,(TapBranch *)&gtest_ar_9.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_12f8,"exp_str","tree.ToString()",
             (char **)&tree_efg.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1318);
  std::__cxx11::string::~string((string *)&local_1318);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12f8);
  if (!bVar2) {
    testing::Message::Message(&local_1320);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_12f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x19b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,&local_1320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(&local_1320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f8);
  __end1 = std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>::begin
                     ((vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> *)local_8e8
                     );
  test_data = (TestScriptTree2Data *)
              std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>::end
                        ((vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> *)
                         local_8e8);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<TestScriptTree2Data_*,_std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>_>
                                     *)&test_data),
        pBVar1 = tree_efg.nodes_.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage, bVar2) {
    pTStack_1348 = __gnu_cxx::
                   __normal_iterator<TestScriptTree2Data_*,_std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>_>
                   ::operator*(&__end1);
    std::operator+(&local_1370,"script_",&pTStack_1348->name);
    testing::ScopedTrace::ScopedTrace
              (&local_1349,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x19e,&local_1370);
    std::__cxx11::string::~string((string *)&local_1370);
    pBVar1 = tree_efg.nodes_.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1428,(char *)pBVar1,&local_1429);
    tapscript = &pTStack_1348->script;
    gtest_ar_11.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_11.message_);
    cfd::core::TaprootScriptTree::FromString
              (&local_1408,&local_1428,tapscript,
               (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_11.message_,kMainnet);
    cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_9.message_,&local_1408);
    cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1408);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_11.message_);
    std::__cxx11::string::~string((string *)&local_1428);
    std::allocator<char>::~allocator((allocator<char> *)&local_1429);
    cfd::core::TapBranch::GetCurrentBranchHash(&local_1490,(TapBranch *)&gtest_ar_9.message_);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1478,&local_1490);
    testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
              ((EqHelper<false> *)local_1458,"exp_hash","tree.GetCurrentBranchHash().GetHex()",
               &exp_str,&local_1478);
    std::__cxx11::string::~string((string *)&local_1478);
    cfd::core::ByteData256::~ByteData256(&local_1490);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1458);
    if (!bVar2) {
      testing::Message::Message(&local_1498);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1458);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x1a0,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1498);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_1498);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1458);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_14d0,(TapBranch *)&gtest_ar_9.message_);
    testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
              ((EqHelper<false> *)local_14b0,"exp_str","tree.ToString()",
               (char **)&tree_efg.nodes_.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_14d0);
    std::__cxx11::string::~string((string *)&local_14d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b0);
    if (!bVar2) {
      testing::Message::Message(&local_14d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_14b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x1a1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_14d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_14d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b0);
    cfd::core::Script::GetHex_abi_cxx11_(&local_1510,&pTStack_1348->script);
    cfd::core::TapBranch::GetScript(&local_1568,(TapBranch *)&gtest_ar_9.message_);
    cfd::core::Script::GetHex_abi_cxx11_(&local_1530,&local_1568);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_14f0,"test_data.script.GetHex()","tree.GetScript().GetHex()"
               ,&local_1510,&local_1530);
    std::__cxx11::string::~string((string *)&local_1530);
    cfd::core::Script::~Script(&local_1568);
    std::__cxx11::string::~string((string *)&local_1510);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14f0);
    if (!bVar2) {
      testing::Message::Message(&local_1570);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_14f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x1a2,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_1570);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_1570);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_14f0);
    lhs = &pTStack_1348->depth;
    cfd::core::TapBranch::GetBranchList(&local_15a8,(TapBranch *)&gtest_ar_9.message_);
    local_1590 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                           (&local_15a8);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_1588,"test_data.depth","tree.GetBranchList().size()",lhs,
               &local_1590);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_15a8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1588);
    if (!bVar2) {
      testing::Message::Message(&local_15b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1588);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)((long)&nodes.field_2 + 8),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x1a3,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)((long)&nodes.field_2 + 8),&local_15b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&nodes.field_2 + 8));
      testing::Message::~Message(&local_15b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1588);
    std::__cxx11::string::string((string *)&__range2);
    cfd::core::TaprootScriptTree::GetNodeList
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&__begin2,
               (TaprootScriptTree *)&gtest_ar_9.message_);
    __end2 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                       ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        &__begin2);
    node = (ByteData256 *)
           std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      &__begin2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                       *)&node), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                ::operator*(&__end2);
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_15.message_,this_00);
      std::__cxx11::string::operator+=((string *)&__range2,(string *)&gtest_ar_15.message_);
      std::__cxx11::string::~string((string *)&gtest_ar_15.message_);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
      ::operator++(&__end2);
    }
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&__begin2)
    ;
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1640,"test_data.nodes","nodes",&pTStack_1348->nodes,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1640);
    if (!bVar2) {
      testing::Message::Message(&local_1648);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1640);
      testing::internal::AssertHelper::AssertHelper
                (&local_1650,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x1a6,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1650,&local_1648);
      testing::internal::AssertHelper::~AssertHelper(&local_1650);
      testing::Message::~Message(&local_1648);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1640);
    std::__cxx11::string::~string((string *)&__range2);
    testing::ScopedTrace::~ScopedTrace(&local_1349);
    __gnu_cxx::
    __normal_iterator<TestScriptTree2Data_*,_std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1708,(char *)pBVar1,&local_1709);
  gtest_ar_16.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_16.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_16e8,&local_1708,(Script *)local_658,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_16.message_,kMainnet);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_9.message_,&local_16e8);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_16e8);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_16.message_);
  std::__cxx11::string::~string((string *)&local_1708);
  std::allocator<char>::~allocator((allocator<char> *)&local_1709);
  cfd::core::TapBranch::GetScript(&local_1790,(TapBranch *)&gtest_ar_9.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_1758,&local_1790);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_1738,"\"xxx\"","tree.GetScript().GetHex()",
             (char (*) [4])0x72b68b,&local_1758);
  std::__cxx11::string::~string((string *)&local_1758);
  cfd::core::Script::~Script(&local_1790);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1738);
  if (!bVar2) {
    testing::Message::Message(&local_1798);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1ac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_1798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_1798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1738);
  cfd::core::Script::GetHex_abi_cxx11_(&local_17d0,(Script *)local_658);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_17b0,"\"xxx\"","script_j.GetHex()",(char (*) [4])0x72b68b,
             &local_17d0);
  std::__cxx11::string::~string((string *)&local_17d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b0);
  if (!bVar2) {
    testing::Message::Message(&local_17d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_17b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x1ad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_17d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_17d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_f98);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_dd0);
  std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>::~vector
            ((vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> *)local_8e8);
  cfd::core::Script::~Script((Script *)local_658);
  cfd::core::Script::~Script((Script *)local_5d0);
  cfd::core::Script::~Script((Script *)local_560);
  cfd::core::Script::~Script((Script *)local_4f0);
  cfd::core::Script::~Script((Script *)local_480);
  cfd::core::Script::~Script((Script *)local_3f8);
  cfd::core::Script::~Script((Script *)local_388);
  cfd::core::Script::~Script((Script *)local_330);
  cfd::core::Script::~Script((Script *)local_2c0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &script_a.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey32.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey31.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey22.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey21.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey2.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey12.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey11.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &schnorr_pubkey1.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pubkey3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pubkey2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_140);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_100);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_c0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest2) {
  //        /\        //
  //       /\ H       //
  //      /  \        //
  //     /\  /\       //
  //    /  D E \      //
  //   / \     /\     //
  //  A   /\  F  G    //
  //     B  C         //
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  ByteData256 tweak3("a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475");
  ByteData256 tweak4("4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e");
  Pubkey pubkey1 = key.GeneratePubkey();
  Pubkey pubkey2 = pubkey1 + tweak3;
  Pubkey pubkey3 = pubkey1 + tweak4;
  SchnorrPubkey schnorr_pubkey1 = SchnorrPubkey::FromPubkey(pubkey1);
  SchnorrPubkey schnorr_pubkey11 = schnorr_pubkey1 + tweak1;
  SchnorrPubkey schnorr_pubkey12 = schnorr_pubkey1 + tweak2;
  SchnorrPubkey schnorr_pubkey2 = SchnorrPubkey::FromPubkey(pubkey2);
  SchnorrPubkey schnorr_pubkey21 = schnorr_pubkey2 + tweak1;
  SchnorrPubkey schnorr_pubkey22 = schnorr_pubkey2 + tweak2;
  SchnorrPubkey schnorr_pubkey3 = SchnorrPubkey::FromPubkey(pubkey3);
  SchnorrPubkey schnorr_pubkey31 = schnorr_pubkey3 + tweak1;
  SchnorrPubkey schnorr_pubkey32 = schnorr_pubkey3 + tweak2;

  Script script_a = (ScriptBuilder() << schnorr_pubkey1.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_b = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_c = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_d = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey12.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // Script script_e = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_e = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_f = (ScriptBuilder() << schnorr_pubkey21.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_g = (ScriptBuilder() << schnorr_pubkey22.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_h = (ScriptBuilder() << schnorr_pubkey31.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_j = (ScriptBuilder() << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  EXPECT_EQ("20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac", script_a.GetHex());
  EXPECT_EQ("51", script_b.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac", script_c.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac", script_d.GetHex());
  EXPECT_EQ("20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac", script_e.GetHex());
  EXPECT_EQ("2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac", script_f.GetHex());
  EXPECT_EQ("204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac", script_g.GetHex());
  EXPECT_EQ("2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_h.GetHex());
  EXPECT_EQ("20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_j.GetHex());

  struct TestScriptTree2Data {
    std::string name;
    Script script;
    size_t depth;
    std::string nodes;
  };
  std::vector<TestScriptTree2Data> exp_list = {
    {
      "a", script_a, 4,
      "4b3bb79ea92e0b4f2bfa7e8c88d81133e347da393d72a37fe9cdcf1f5f56b5e0e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "b", script_b, 5,
      "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "c", script_c, 5,
      "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d6754691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "d", script_d, 3,
      "7da36533760cede4c164d5c00eb1500a27dd86ca76914a9874112c43e0c1b9450db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "e", script_e, 3,
      "aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "f", script_f, 4,
      "1aac269b1edaa45c69fb8d1a703a1bb69e90129cef7b7cfe9e676b28e6d1175d7f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "g", script_g, 4,
      "e82da59bb829eb21f7cb8eb9eb128626da9a9a31f3dfdeb29766faf14468e9967f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "h", script_h, 1, "8f43855f8d9916a2cece54e67b4ce08950a60cc3cce8907d34e03788ade5a977"
    },
  };

  auto exp_hash = "ca0e12942fdb00ad71e84e02c44c0b9136e60ff2c25bcb3cade4d7dc53d246df";
  auto exp_str = "{{{tl(20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}";
  TaprootScriptTree tree_efg(script_f);
  tree_efg.AddBranch(TaprootScriptTree(script_g));
  tree_efg.AddBranch(TaprootScriptTree(script_e));

  TaprootScriptTree tree_b(script_b);
  tree_b.AddBranch(TaprootScriptTree(script_c));
  tree_b.AddBranch(TaprootScriptTree(script_a));
  tree_b.AddBranch(TaprootScriptTree(script_d));
  tree_b.AddBranch(tree_efg);
  tree_b.AddBranch(TaprootScriptTree(script_h));

  TaprootScriptTree tree = tree_b;
  EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, tree.ToString());

  for (const auto& test_data : exp_list) {
    SCOPED_TRACE("script_" + test_data.name);
    tree = TaprootScriptTree::FromString(exp_str, test_data.script);
    EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
    EXPECT_EQ(exp_str, tree.ToString());
    EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
    EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
    std::string nodes;
    for (const auto& node : tree.GetNodeList()) nodes += node.GetHex();
    EXPECT_EQ(test_data.nodes, nodes);
  }

  // invalid leaf
  try {
    tree = TaprootScriptTree::FromString(exp_str, script_j);
    EXPECT_EQ("xxx", tree.GetScript().GetHex());
    EXPECT_EQ("xxx", script_j.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ(
      "This tapscript not exist in this tree.",
      except.what());
  }
}